

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O1

TestBuilder * __thiscall
anon_unknown.dwarf_15bc091::TestBuilder::PushSig
          (TestBuilder *this,CKey *key,int nHashType,uint lenR,uint lenS,SigVersion sigversion,
          CAmount amount)

{
  uchar *__src;
  long lVar1;
  pointer puVar2;
  pointer puVar3;
  vector<unsigned_char,std::allocator<unsigned_char>> vVar4;
  uchar *puVar5;
  uchar *puVar6;
  pointer puVar7;
  pointer puVar8;
  pointer puVar9;
  pointer puVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  uchar *puVar14;
  uint32_t test_case;
  long in_FS_OFFSET;
  pointer local_108;
  pointer local_f8;
  pointer local_f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchSig;
  allocator_type local_99;
  uchar *local_98;
  uchar *puStack_90;
  pointer local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  uint256 hash;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  SignatureHash<CMutableTransaction>
            (&hash,&this->script,&this->spendTx,0,nHashType,&amount,sigversion,
             (PrecomputedTransactionData *)0x0);
  local_f0 = (pointer)0x0;
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108 = (pointer)0x0;
  local_f8 = (pointer)0x0;
  test_case = 0;
  puVar14 = (uchar *)0x0;
  do {
    CKey::Sign(key,&hash,&vchSig,false,test_case);
    if ((vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start
         [(ulong)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start[3] + 5] != '!') == (lenS == 0x21)) {
      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_98,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_start + 4),
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_start +
                   (ulong)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start[3] + 4),&local_99);
      puVar7 = local_88;
      puVar6 = puStack_90;
      puVar5 = local_98;
      uVar11 = (ulong)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start[3];
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_98,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_start + uVar11 + 6),
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_start +
                   vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar11 + 5] + uVar11 + 6),&local_99);
      puVar10 = local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      puVar8 = local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_98;
      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_90;
      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_88;
      local_98 = (uchar *)0x0;
      puStack_90 = (uchar *)0x0;
      local_88 = (pointer)0x0;
      if (puVar8 != (pointer)0x0) {
        operator_delete(puVar8,(long)puVar10 - (long)puVar8);
      }
      if (local_98 != (uchar *)0x0) {
        operator_delete(local_98,(long)local_88 - (long)local_98);
      }
      uVar11 = (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      while (uVar11 < 0x21) {
        local_98 = (uchar *)((ulong)local_98 & 0xffffffffffffff00);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_insert_rval
                  (&local_78,
                   (const_iterator)
                   local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,(value_type_conflict3 *)&local_98);
        uVar11 = (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
      }
      iVar13 = 0;
      uVar11 = 0x21;
      do {
        iVar12 = ((uint)(byte)(anonymous_namespace)::vchKey2[uVar11 + 0x1f] + iVar13) -
                 (uint)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar11 - 1];
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar11 - 1] = (uchar)iVar12;
        iVar13 = iVar12 >> 0x1f;
        uVar11 = uVar11 - 1;
      } while (1 < uVar11);
      if (iVar12 < 0) {
        __assert_fail("carry == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
                      ,0xa5,"void NegateSignatureS(std::vector<unsigned char> &)");
      }
      if (((1 < (ulong)((long)local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_78.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start)) &&
          (*local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == '\0')) &&
         (-1 < (char)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[1])) {
        __src = local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start + 1;
        if (__src != local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish) {
          memmove(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start,__src,
                  (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)__src);
        }
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
      }
      if (vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      local_98._0_1_ = (vector<unsigned_char,std::allocator<unsigned_char>>)0x30;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&vchSig,(uchar *)&local_98);
      vVar4 = (vector<unsigned_char,std::allocator<unsigned_char>>)((char)puVar6 - (char)puVar5);
      local_98._0_1_ =
           (vector<unsigned_char,std::allocator<unsigned_char>>)
           ((((char)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish + (char)vVar4) -
            (char)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start) + '\x04');
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&vchSig,(uchar *)&local_98);
      local_98._0_1_ = (vector<unsigned_char,std::allocator<unsigned_char>>)0x2;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&vchSig,(uchar *)&local_98);
      local_98._0_1_ = vVar4;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&vchSig,(uchar *)&local_98);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&vchSig,
                 vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,puVar5,puVar6);
      local_98._0_1_ = (vector<unsigned_char,std::allocator<unsigned_char>>)0x2;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&vchSig,(uchar *)&local_98);
      local_98 = (uchar *)CONCAT71(local_98._1_7_,
                                   (char)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (char)local_78.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&vchSig,(uchar *)&local_98);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&vchSig,
                 vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (puVar5 != (uchar *)0x0) {
        operator_delete(puVar5,(long)puVar7 - (long)puVar5);
      }
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_78,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start + 4),
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start +
                 (ulong)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start[3] + 4),(allocator_type *)&local_98
              );
    puVar10 = local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    puVar8 = local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar7 = local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar14 != (uchar *)0x0) {
      operator_delete(puVar14,(long)local_f8 - (long)puVar14);
    }
    if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    uVar11 = (ulong)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_start[3];
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_78,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar11 + 6),
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start +
                 vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar11 + 5] + uVar11 + 6),
               (allocator_type *)&local_98);
    puVar3 = local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    puVar9 = local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar2 = local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (uchar *)0x0;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (uchar *)0x0;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_108 != (pointer)0x0) {
      operator_delete(local_108,(long)local_f0 - (long)local_108);
    }
    if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    test_case = test_case + 1;
    local_f8 = puVar10;
    puVar14 = puVar7;
    local_108 = puVar2;
    local_f0 = puVar3;
    if ((long)puVar8 - (long)puVar7 == (ulong)lenR) {
      local_f0 = puVar3;
      local_108 = puVar2;
      if ((long)puVar9 - (long)puVar2 == (ulong)lenS) {
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(local_78.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,(char)nHashType);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&vchSig,(uchar *)&local_78);
        DoPush(this,&vchSig);
        if (puVar2 != (pointer)0x0) {
          operator_delete(puVar2,(long)puVar3 - (long)puVar2);
        }
        if (puVar7 != (uchar *)0x0) {
          operator_delete(puVar7,(long)puVar10 - (long)puVar7);
        }
        if (vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)vchSig.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)vchSig.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
          __stack_chk_fail();
        }
        return this;
      }
    }
  } while( true );
}

Assistant:

TestBuilder& PushSig(const CKey& key, int nHashType = SIGHASH_ALL, unsigned int lenR = 32, unsigned int lenS = 32, SigVersion sigversion = SigVersion::BASE, CAmount amount = 0)
    {
        uint256 hash = SignatureHash(script, spendTx, 0, nHashType, amount, sigversion);
        std::vector<unsigned char> vchSig, r, s;
        uint32_t iter = 0;
        do {
            key.Sign(hash, vchSig, false, iter++);
            if ((lenS == 33) != (vchSig[5 + vchSig[3]] == 33)) {
                NegateSignatureS(vchSig);
            }
            r = std::vector<unsigned char>(vchSig.begin() + 4, vchSig.begin() + 4 + vchSig[3]);
            s = std::vector<unsigned char>(vchSig.begin() + 6 + vchSig[3], vchSig.begin() + 6 + vchSig[3] + vchSig[5 + vchSig[3]]);
        } while (lenR != r.size() || lenS != s.size());
        vchSig.push_back(static_cast<unsigned char>(nHashType));
        DoPush(vchSig);
        return *this;
    }